

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::updateAncestorFlag
          (QGraphicsItemPrivate *this,GraphicsItemFlag childFlag,AncestorFlag flag,bool enabled,
          bool root)

{
  QGraphicsItemPrivate *pQVar1;
  sbyte sVar2;
  uint uVar3;
  ulong uVar4;
  undefined7 in_register_00000081;
  int i;
  ulong uVar5;
  
  if ((int)CONCAT71(in_register_00000081,root) == 0) {
    uVar5 = *(ulong *)&this->field_0x160;
    if ((((AncestorFlag)(uVar5 >> 0x10) & 0xffff & flag &
         (AncestorContainsChildren|AncestorFiltersChildEvents|AncestorIgnoresTransformations|
          AncestorClipsChildren|AncestorHandlesChildEvents)) != NoFlag) == enabled) {
      return;
    }
    if (enabled) {
      uVar3 = flag << 0x10 | (uint)uVar5;
    }
    else {
      uVar3 = ~flag << 0x10 & (uint)uVar5;
    }
    uVar4 = uVar5 & 0xffffffffffe0ffff | (ulong)(uVar3 & 0x1f0000);
    *(ulong *)&this->field_0x160 = uVar4;
    if (childFlag == 0xffffffff) {
      if (((uint)uVar4 >> 0xd & 1) != 0) {
        return;
      }
    }
    else {
      if (((GraphicsItemFlag)(uVar5 >> 0x20) & childFlag &
          (ItemContainsChildrenInShape|ItemStopsFocusHandling|ItemStopsClickFocusPropagation|
           ItemSendsScenePositionChanges|ItemIsFocusScope|ItemIsPanel|
           ItemNegativeZStacksBehindParent|ItemAcceptsInputMethod|ItemSendsGeometryChanges|
           ItemHasNoContents|ItemUsesExtendedStyleOption|ItemStacksBehindParent|
           ItemDoesntPropagateOpacityToChildren|ItemIgnoresParentOpacity|ItemIgnoresTransformations|
           ItemClipsChildrenToShape|ItemClipsToShape|ItemIsFocusable|ItemIsSelectable|ItemIsMovable)
          ) == childFlag) {
        return;
      }
      if ((uVar5 >> 0x3d & 1) != 0 && childFlag == ~ItemIsMovable) {
        return;
      }
    }
    goto LAB_0056fd91;
  }
  pQVar1 = this;
  if (childFlag == ItemContainsChildrenInShape) {
    flag = AncestorContainsChildren;
    sVar2 = 0x33;
  }
  else if (childFlag == 0xffffffff) {
    pQVar1 = (this->q_ptr->d_ptr).d;
    flag = AncestorHandlesChildEvents;
    sVar2 = 0xd;
  }
  else if (childFlag == ItemClipsChildrenToShape) {
    flag = AncestorClipsChildren;
    sVar2 = 0x24;
  }
  else if (childFlag == ItemIgnoresTransformations) {
    flag = AncestorIgnoresTransformations;
    sVar2 = 0x25;
  }
  else {
    if (childFlag != ~ItemIsMovable) {
      return;
    }
    pQVar1 = (this->q_ptr->d_ptr).d;
    flag = AncestorFiltersChildEvents;
    sVar2 = 0x3d;
  }
  enabled = SUB81(*(ulong *)&pQVar1->field_0x160 >> sVar2,0);
  if (this->parent == (QGraphicsItem *)0x0) {
    this->field_0x162 = this->field_0x162 & 0xe0;
    goto LAB_0056fd91;
  }
  uVar5 = *(ulong *)&((this->parent->d_ptr).d)->field_0x160;
  if ((((AncestorFlag)(uVar5 >> 0x10) & 0xffff & flag) == NoFlag) &&
     (((GraphicsItemFlag)(uVar5 >> 0x20) & childFlag &
      (ItemContainsChildrenInShape|ItemStopsFocusHandling|ItemStopsClickFocusPropagation|
       ItemSendsScenePositionChanges|ItemIsFocusScope|ItemIsPanel|ItemNegativeZStacksBehindParent|
       ItemAcceptsInputMethod|ItemSendsGeometryChanges|ItemHasNoContents|ItemUsesExtendedStyleOption
       |ItemStacksBehindParent|ItemDoesntPropagateOpacityToChildren|ItemIgnoresParentOpacity|
       ItemIgnoresTransformations|ItemClipsChildrenToShape|ItemClipsToShape|ItemIsFocusable|
       ItemIsSelectable|ItemIsMovable)) != childFlag)) {
    if (childFlag == ~ItemIsMovable) {
      if ((uVar5 >> 0x3d & 1) != 0) goto LAB_0056fd5f;
    }
    else if ((childFlag == 0xffffffff) && (((uint)uVar5 >> 0xd & 1) != 0)) goto LAB_0056fd5f;
    *(ulong *)&this->field_0x160 =
         *(ulong *)&this->field_0x160 & 0xffffffffffe0ffff |
         (ulong)(~flag << 0x10 & (uint)*(ulong *)&this->field_0x160 & 0x1f0000);
  }
  else {
LAB_0056fd5f:
    *(ulong *)&this->field_0x160 =
         *(ulong *)&this->field_0x160 & 0xffffffffffe0ffff |
         (ulong)((uint)*(ulong *)&this->field_0x160 & 0x1f0000 | flag << 0x10);
    enabled = true;
  }
LAB_0056fd91:
  for (uVar5 = 0; uVar5 < (ulong)(this->children).d.size; uVar5 = uVar5 + 1) {
    updateAncestorFlag(((this->children).d.ptr[uVar5]->d_ptr).d,childFlag,flag,(bool)(enabled & 1),
                       false);
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateAncestorFlag(QGraphicsItem::GraphicsItemFlag childFlag,
                                           AncestorFlag flag, bool enabled, bool root)
{
    Q_Q(QGraphicsItem);
    if (root) {
        // For root items only. This is the item that has either enabled or
        // disabled \a childFlag, or has been reparented.
        switch (int(childFlag)) {
        case -2:
            flag = AncestorFiltersChildEvents;
            enabled = q->filtersChildEvents();
            break;
        case -1:
            flag = AncestorHandlesChildEvents;
            enabled = q->handlesChildEvents();
            break;
        case QGraphicsItem::ItemClipsChildrenToShape:
            flag = AncestorClipsChildren;
            enabled = flags & QGraphicsItem::ItemClipsChildrenToShape;
            break;
        case QGraphicsItem::ItemIgnoresTransformations:
            flag = AncestorIgnoresTransformations;
            enabled = flags & QGraphicsItem::ItemIgnoresTransformations;
            break;
        case QGraphicsItem::ItemContainsChildrenInShape:
            flag = AncestorContainsChildren;
            enabled = flags & QGraphicsItem::ItemContainsChildrenInShape;
            break;
        default:
            return;
        }

        if (parent) {
            // Inherit the enabled-state from our parents.
            if ((parent->d_ptr->ancestorFlags & flag)
                    || (int(parent->d_ptr->flags & childFlag) == childFlag)
                    || (int(childFlag) == -1 && parent->d_ptr->handlesChildEvents)
                    || (int(childFlag) == -2 && parent->d_ptr->filtersDescendantEvents)) {
                enabled = true;
                ancestorFlags |= flag;
            } else {
                ancestorFlags &= ~flag;
            }
        } else {
            // Top-level root items don't have any ancestors, so there are no
            // ancestor flags either.
            ancestorFlags = 0;
        }
    } else {
        // Don't set or propagate the ancestor flag if it's already correct.
        if (((ancestorFlags & flag) && enabled) || (!(ancestorFlags & flag) && !enabled))
            return;

        // Set the flag.
        if (enabled)
            ancestorFlags |= flag;
        else
            ancestorFlags &= ~flag;

        // Don't process children if the item has the main flag set on itself.
        if ((int(childFlag) != -1 &&  int(flags & childFlag) == childFlag)
            || (int(childFlag) == -1 && handlesChildEvents)
            || (int(childFlag) == -2 && filtersDescendantEvents))
            return;
    }

    for (int i = 0; i < children.size(); ++i)
        children.at(i)->d_ptr->updateAncestorFlag(childFlag, flag, enabled, false);
}